

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

Gia_Man_t * Gia_ManBalance(Gia_Man_t *p,int fSimpleAnd,int fStrict,int fVerbose)

{
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  undefined8 local_40;
  Gia_Man_t *pNew2;
  Gia_Man_t *pNew1;
  Gia_Man_t *pNew;
  int fVerbose_local;
  int fStrict_local;
  int fSimpleAnd_local;
  Gia_Man_t *p_local;
  
  if (fVerbose != 0) {
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  if (fSimpleAnd == 0) {
    local_40 = Gia_ManDupMuxes(p,2);
  }
  else {
    local_40 = Gia_ManDup(p);
  }
  Gia_ManTransferTiming(local_40,p);
  if (fVerbose != 0) {
    Gia_ManPrintStats(local_40,(Gps_Par_t *)0x0);
  }
  p_00 = Gia_ManBalanceInt(local_40,fStrict);
  Gia_ManTransferTiming(p_00,local_40);
  if (fVerbose != 0) {
    Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(local_40);
  p_01 = Gia_ManDupNoMuxes(p_00,0);
  Gia_ManTransferTiming(p_01,p_00);
  if (fVerbose != 0) {
    Gia_ManPrintStats(p_01,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManBalance( Gia_Man_t * p, int fSimpleAnd, int fStrict, int fVerbose )
{
    Gia_Man_t * pNew, * pNew1, * pNew2;
    if ( fVerbose )      Gia_ManPrintStats( p, NULL );
    pNew = fSimpleAnd ? Gia_ManDup( p ) : Gia_ManDupMuxes( p, 2 );
    Gia_ManTransferTiming( pNew, p );
    if ( fVerbose )      Gia_ManPrintStats( pNew, NULL );
    pNew1 = Gia_ManBalanceInt( pNew, fStrict );
    Gia_ManTransferTiming( pNew1, pNew );
    if ( fVerbose )      Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    pNew2 = Gia_ManDupNoMuxes( pNew1, 0 );
    Gia_ManTransferTiming( pNew2, pNew1 );
    if ( fVerbose )      Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    return pNew2;
}